

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X86ATTInstPrinter.c
# Opt level: O3

void printOperand(MCInst *MI,uint OpNo,SStream *O)

{
  uint8_t *puVar1;
  cs_detail *pcVar2;
  _Bool _Var3;
  byte bVar4;
  uint uVar5;
  MCOperand *op;
  ulong uVar6;
  uint8_t uVar7;
  uint uVar8;
  ulong uVar9;
  char *fmt;
  uint8_t uVar10;
  
  op = MCInst_getOperand(MI,OpNo);
  _Var3 = MCOperand_isReg(op);
  if (_Var3) {
    uVar5 = MCOperand_getReg(op);
    SStream_concat0(O,&getRegisterName_AsmStrs +
                      *(uint *)(getRegisterName_RegAsmOffset + (ulong)(uVar5 - 1) * 4));
    if (MI->csh->detail != CS_OPT_OFF) {
      pcVar2 = MI->flat_insn->detail;
      uVar8 = (uint)(pcVar2->field_6).x86.op_count;
      if (MI->csh->doing_mem == true) {
        *(uint *)(pcVar2->groups + (ulong)(uVar8 * 0x30) + 0x4a) = uVar5;
      }
      else {
        puVar1 = pcVar2->groups + (ulong)(uVar8 * 0x30) + 0x3e;
        puVar1[0] = '\x01';
        puVar1[1] = '\0';
        puVar1[2] = '\0';
        puVar1[3] = '\0';
        pcVar2 = MI->flat_insn->detail;
        *(uint *)(pcVar2->groups + (ulong)((uint)(pcVar2->field_6).x86.op_count * 0x30) + 0x46) =
             uVar5;
        pcVar2 = MI->flat_insn->detail;
        pcVar2->groups[(ulong)((uint)(pcVar2->field_6).x86.op_count * 0x30) + 0x5e] =
             MI->csh->regsize_map[uVar5];
        puVar1 = &(MI->flat_insn->detail->field_6).x86.op_count;
        *puVar1 = *puVar1 + '\x01';
      }
    }
    if (MI->op1_size != '\0') {
      return;
    }
    MI->op1_size = MI->csh->regsize_map[uVar5];
    return;
  }
  _Var3 = MCOperand_isImm(op);
  if (!_Var3) {
    return;
  }
  uVar6 = MCOperand_getImm(op);
  uVar5 = MCInst_getOpcode(MI);
  uVar10 = '\0';
  uVar7 = uVar10;
  if ((int)uVar5 < 0x905) {
    if ((int)uVar5 < 0x4df) {
      if ((int)uVar5 < 0xc6) {
        if (((0x33 < uVar5 - 0x3b) ||
            ((0xd80000000000bU >> ((ulong)(uVar5 - 0x3b) & 0x3f) & 1) == 0)) && (1 < uVar5 - 0x15))
        goto LAB_001a26dc;
      }
      else if ((0x10 < uVar5 - 0x212) || ((0x16201U >> (uVar5 - 0x212 & 0x1f) & 1) == 0)) {
        uVar5 = uVar5 - 0xc6;
        goto LAB_001a266e;
      }
      goto LAB_001a26d2;
    }
    if ((int)uVar5 < 0x75a) {
      if ((uVar5 - 0x4df < 0x36) &&
         ((0x20040040000801U >> ((ulong)(uVar5 - 0x4df) & 0x3f) & 1) != 0)) goto LAB_001a26d2;
      uVar5 = uVar5 - 0x662;
      if (uVar5 < 7) {
        uVar8 = 0x61;
        goto LAB_001a2634;
      }
    }
    else if (((uVar5 - 0x75a < 0x11) && ((0x1001bU >> (uVar5 - 0x75a & 0x1f) & 1) != 0)) ||
            (uVar5 == 0x8d6)) goto LAB_001a26d2;
  }
  else {
    if ((int)uVar5 < 0xa49) {
      if (((0x3f < uVar5 - 0x9ae) ||
          ((0xb000000012000009U >> ((ulong)(uVar5 - 0x9ae) & 0x3f) & 1) == 0)) &&
         ((0x23 < uVar5 - 0x905 || ((0x900000009U >> ((ulong)(uVar5 - 0x905) & 0x3f) & 1) == 0)))) {
        uVar5 = uVar5 - 0x966;
        if (uVar5 < 0x1c) {
          uVar8 = 0x9000009;
LAB_001a2634:
          if ((uVar8 >> (uVar5 & 0x1f) & 1) != 0) goto LAB_001a26d2;
        }
        goto LAB_001a26dc;
      }
    }
    else if ((int)uVar5 < 0xb54) {
      if ((0x2b < uVar5 - 0xa49) || ((0x90000000009U >> ((ulong)(uVar5 - 0xa49) & 0x3f) & 1) == 0))
      {
        uVar5 = uVar5 - 0xaed;
        goto LAB_001a266e;
      }
    }
    else if (5 < uVar5 - 0xb54) {
      uVar5 = uVar5 - 0x1863;
LAB_001a266e:
      uVar7 = '\0';
      if ((4 < uVar5) || (uVar7 = uVar10, uVar5 == 2)) goto LAB_001a26dc;
    }
LAB_001a26d2:
    uVar6 = uVar6 & 0xff;
    uVar7 = '\x01';
  }
LAB_001a26dc:
  uVar5 = MI->flat_insn->id;
  if ((int)uVar5 < 0x9c) {
    if (uVar5 == 0x19) {
LAB_001a2726:
      if (9 < uVar6) {
        bVar4 = MI->op1_size;
        if (bVar4 == 0) {
          bVar4 = MI->imm_size;
        }
        uVar6 = uVar6 & arch_masks[bVar4];
LAB_001a276c:
        fmt = "0x%lx";
        uVar9 = uVar6;
        goto LAB_001a2791;
      }
    }
    else {
      if (uVar5 != 0x95) goto LAB_001a2775;
      if (9 < uVar6) {
        uVar9 = uVar6 & 0xffff;
        fmt = "0x%x";
        uVar6 = uVar9;
        goto LAB_001a2791;
      }
    }
    fmt = "%u";
    uVar9 = uVar6;
  }
  else {
    if (uVar5 - 0x9c < 2) {
      if (OpNo == 1) {
        uVar7 = '\x02';
      }
      if (OpNo == 1) {
        uVar6 = uVar6 & 0xffff;
      }
      if (9 < (long)uVar6) goto LAB_001a276c;
    }
    else {
      if ((uVar5 == 0x145) || (uVar5 == 0x147)) goto LAB_001a2726;
LAB_001a2775:
      if ((long)uVar6 < 0) {
        uVar9 = -uVar6;
        if (uVar6 < 0xfffffffffffffff7) {
          fmt = "-0x%lx";
        }
        else {
          fmt = "-%lu";
        }
        goto LAB_001a2791;
      }
      if (9 < uVar6) goto LAB_001a276c;
    }
    fmt = "%lu";
    uVar9 = uVar6;
  }
LAB_001a2791:
  SStream_concat(O,fmt,uVar9);
  if (MI->csh->detail != CS_OPT_OFF) {
    pcVar2 = MI->flat_insn->detail;
    uVar5 = (uint)(pcVar2->field_6).x86.op_count;
    if (MI->csh->doing_mem == true) {
      *(ulong *)(pcVar2->groups + (ulong)(uVar5 * 0x30) + 0x56) = uVar6;
    }
    else {
      puVar1 = pcVar2->groups + (ulong)(uVar5 * 0x30) + 0x3e;
      puVar1[0] = '\x02';
      puVar1[1] = '\0';
      puVar1[2] = '\0';
      puVar1[3] = '\0';
      if (uVar7 == '\0') {
        pcVar2 = MI->flat_insn->detail;
        bVar4 = (pcVar2->field_6).x86.op_count;
        if (bVar4 == 0) {
          *(uint8_t *)((long)&pcVar2->field_6 + 0x50) = MI->imm_size;
        }
        else {
          if ((MI->flat_insn->id & 0xfffffffe) == 0x9c) {
            uVar7 = MI->imm_size;
          }
          else {
            uVar7 = *(uint8_t *)((long)&pcVar2->field_6 + 0x50);
          }
          pcVar2->groups[(ulong)((uint)bVar4 * 0x30) + 0x5e] = uVar7;
        }
      }
      else {
        pcVar2 = MI->flat_insn->detail;
        pcVar2->groups[(ulong)((uint)(pcVar2->field_6).x86.op_count * 0x30) + 0x5e] = uVar7;
      }
      pcVar2 = MI->flat_insn->detail;
      *(ulong *)(pcVar2->groups + (ulong)((uint)(pcVar2->field_6).x86.op_count * 0x30) + 0x46) =
           uVar6;
      puVar1 = &(MI->flat_insn->detail->field_6).x86.op_count;
      *puVar1 = *puVar1 + '\x01';
    }
  }
  return;
}

Assistant:

static void printOperand(MCInst *MI, unsigned OpNo, SStream *O)
{
	int opsize = 0;
	MCOperand *Op  = MCInst_getOperand(MI, OpNo);

	if (MCOperand_isReg(Op)) {
		unsigned int reg = MCOperand_getReg(Op);
		printRegName(O, reg);
		if (MI->csh->detail) {
			if (MI->csh->doing_mem) {
				MI->flat_insn->detail->x86.operands[MI->flat_insn->detail->x86.op_count].mem.base = reg;
			} else {
				MI->flat_insn->detail->x86.operands[MI->flat_insn->detail->x86.op_count].type = X86_OP_REG;
				MI->flat_insn->detail->x86.operands[MI->flat_insn->detail->x86.op_count].reg = reg;
				MI->flat_insn->detail->x86.operands[MI->flat_insn->detail->x86.op_count].size = MI->csh->regsize_map[reg];
				MI->flat_insn->detail->x86.op_count++;
			}
		}
	} else if (MCOperand_isImm(Op)) {
		// Print X86 immediates as signed values.
		int64_t imm = MCOperand_getImm(Op);

		switch(MCInst_getOpcode(MI)) {
			default:
				break;

			case X86_AAD8i8:
			case X86_AAM8i8:
			case X86_ADC8i8:
			case X86_ADD8i8:
			case X86_AND8i8:
			case X86_CMP8i8:
			case X86_OR8i8:
			case X86_SBB8i8:
			case X86_SUB8i8:
			case X86_TEST8i8:
			case X86_XOR8i8:
			case X86_ROL8ri:
			case X86_ADC8ri:
			case X86_ADD8ri:
			case X86_ADD8ri8:
			case X86_AND8ri:
			case X86_AND8ri8:
			case X86_CMP8ri:
			case X86_MOV8ri:
			case X86_MOV8ri_alt:
			case X86_OR8ri:
			case X86_OR8ri8:
			case X86_RCL8ri:
			case X86_RCR8ri:
			case X86_ROR8ri:
			case X86_SAL8ri:
			case X86_SAR8ri:
			case X86_SBB8ri:
			case X86_SHL8ri:
			case X86_SHR8ri:
			case X86_SUB8ri:
			case X86_SUB8ri8:
			case X86_TEST8ri:
			case X86_TEST8ri_NOREX:
			case X86_TEST8ri_alt:
			case X86_XOR8ri:
			case X86_XOR8ri8:
			case X86_OUT8ir:

			case X86_ADC8mi:
			case X86_ADD8mi:
			case X86_AND8mi:
			case X86_CMP8mi:
			case X86_LOCK_ADD8mi:
			case X86_LOCK_AND8mi:
			case X86_LOCK_OR8mi:
			case X86_LOCK_SUB8mi:
			case X86_LOCK_XOR8mi:
			case X86_MOV8mi:
			case X86_OR8mi:
			case X86_RCL8mi:
			case X86_RCR8mi:
			case X86_ROL8mi:
			case X86_ROR8mi:
			case X86_SAL8mi:
			case X86_SAR8mi:
			case X86_SBB8mi:
			case X86_SHL8mi:
			case X86_SHR8mi:
			case X86_SUB8mi:
			case X86_TEST8mi:
			case X86_TEST8mi_alt:
			case X86_XOR8mi:
			case X86_PUSH64i8:
			case X86_CMP32ri8:
			case X86_CMP64ri8:

				imm = imm & 0xff;
				opsize = 1;     // immediate of 1 byte
				break;
		}

		switch(MI->flat_insn->id) {
			default:
				if (imm >= 0) {
					if (imm > HEX_THRESHOLD)
						SStream_concat(O, "$0x%"PRIx64, imm);
					else
						SStream_concat(O, "$%"PRIu64, imm);
				} else {
					if (imm < -HEX_THRESHOLD)
						SStream_concat(O, "$-0x%"PRIx64, -imm);
					else
						SStream_concat(O, "$-%"PRIu64, -imm);
				}
				break;

			case X86_INS_INT:
				// do not print number in negative form
				imm = imm & 0xff;
				if (imm >= 0 && imm <= HEX_THRESHOLD)
					SStream_concat(O, "$%u", imm);
				else {
					SStream_concat(O, "$0x%x", imm);
				}
				break;

			case X86_INS_LCALL:
			case X86_INS_LJMP:
				// always print address in positive form
				if (OpNo == 1) { // selector is ptr16
					imm = imm & 0xffff;
					opsize = 2;
				}
				SStream_concat(O, "$0x%"PRIx64, imm);
				break;

			case X86_INS_AND:
			case X86_INS_OR:
			case X86_INS_XOR:
				// do not print number in negative form
				if (imm >= 0 && imm <= HEX_THRESHOLD)
					SStream_concat(O, "$%u", imm);
				else {
					imm = arch_masks[MI->op1_size? MI->op1_size : MI->imm_size] & imm;
					SStream_concat(O, "$0x%"PRIx64, imm);
				}
				break;

			case X86_INS_RET:
				// RET imm16
				if (imm >= 0 && imm <= HEX_THRESHOLD)
					SStream_concat(O, "$%u", imm);
				else {
					imm = 0xffff & imm;
					SStream_concat(O, "$0x%x", imm);
				}
				break;
		}

		if (MI->csh->detail) {
			if (MI->csh->doing_mem) {
				MI->flat_insn->detail->x86.operands[MI->flat_insn->detail->x86.op_count].type = X86_OP_MEM;
				MI->flat_insn->detail->x86.operands[MI->flat_insn->detail->x86.op_count].mem.disp = imm;
			} else {
				MI->flat_insn->detail->x86.operands[MI->flat_insn->detail->x86.op_count].type = X86_OP_IMM;
				MI->has_imm = true;
				MI->flat_insn->detail->x86.operands[MI->flat_insn->detail->x86.op_count].imm = imm;

				if (opsize > 0)
					MI->flat_insn->detail->x86.operands[MI->flat_insn->detail->x86.op_count].size = opsize;
				else if (MI->op1_size > 0)
					MI->flat_insn->detail->x86.operands[MI->flat_insn->detail->x86.op_count].size = MI->op1_size;
				else
					MI->flat_insn->detail->x86.operands[MI->flat_insn->detail->x86.op_count].size = MI->imm_size;

				MI->flat_insn->detail->x86.op_count++;
			}
		}
	}
}